

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_misc.c
# Opt level: O3

void oscformat_set(t_oscformat *x,t_symbol *s,int argc,t_atom *argv)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  ulong newsize;
  char buf [1000];
  char local_418;
  char local_417 [999];
  
  *x->x_pathbuf = '\0';
  local_418 = '/';
  if (0 < argc) {
    uVar4 = (ulong)(uint)argc;
    do {
      if ((argv->a_type != A_SYMBOL) ||
         (pcVar3 = &local_418, *((argv->a_w).w_symbol)->s_name != '/')) {
        pcVar3 = local_417;
      }
      atom_string(argv,pcVar3,999);
      sVar1 = strlen(&local_418);
      pcVar3 = x->x_pathbuf;
      sVar2 = strlen(pcVar3);
      newsize = sVar1 + sVar2 + 1;
      if (x->x_pathsize < newsize) {
        pcVar3 = (char *)resizebytes(pcVar3,x->x_pathsize,newsize);
        x->x_pathbuf = pcVar3;
        x->x_pathsize = newsize;
      }
      strcat(pcVar3,&local_418);
      argv = argv + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

static void oscformat_set(t_oscformat *x, t_symbol *s, int argc, t_atom *argv)
{
    char buf[MAXPDSTRING];
    int i;
    size_t newsize;
    *x->x_pathbuf = 0;
    buf[0] = '/';
    for (i = 0; i < argc; i++)
    {
        char *where = (argv[i].a_type == A_SYMBOL &&
            *argv[i].a_w.w_symbol->s_name == '/' ? buf : buf+1);
        atom_string(&argv[i], where, MAXPDSTRING-1);
        if ((newsize = strlen(buf) + strlen(x->x_pathbuf) + 1) > x->x_pathsize)
        {
            x->x_pathbuf = resizebytes(x->x_pathbuf, x->x_pathsize, newsize);
            x->x_pathsize = newsize;
        }
        strcat(x->x_pathbuf, buf);
    }
}